

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::eliminatePivot(CLUFactor<double> *this,int prow,int pos,double eps)

{
  double val;
  int iVar1;
  int p_col;
  pointer pdVar2;
  Pring *pPVar3;
  Pring *pPVar4;
  Pring *pPVar5;
  int *piVar6;
  int *piVar7;
  double *pdVar8;
  int *piVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  int *piVar13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  int *piVar17;
  int lv;
  uint uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  
  piVar14 = (this->u).row.len;
  iVar19 = (this->u).row.start[prow];
  lVar20 = (long)iVar19;
  iVar1 = piVar14[prow];
  iVar10 = (int)((long)iVar1 + -1);
  piVar14[prow] = iVar10;
  iVar12 = pos + iVar19;
  pdVar2 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar14 = (this->u).row.idx;
  p_col = piVar14[iVar12];
  val = pdVar2[iVar12];
  pPVar3 = (this->temp).pivot_col;
  pPVar4 = pPVar3[p_col].next;
  pPVar5 = pPVar3[p_col].prev;
  pPVar4->prev = pPVar5;
  pPVar5->next = pPVar4;
  pPVar3[p_col].next = pPVar3 + p_col;
  pPVar3[p_col].prev = pPVar3 + p_col;
  lVar15 = (long)(iVar10 + iVar19);
  piVar14[iVar12] = piVar14[lVar15];
  pdVar2[iVar12] = pdVar2[lVar15];
  iVar19 = (this->temp).stage;
  (this->temp).stage = iVar19 + 1;
  setPivot(this,iVar19,p_col,prow,val);
  iVar19 = (this->temp).s_cact[p_col];
  iVar12 = -1;
  if (1 < iVar19) {
    iVar12 = makeLvec(this,iVar19 + -1,prow);
  }
  if (iVar1 < 2) {
    piVar13 = (this->u).col.len;
    piVar14 = (this->temp).s_cact;
    piVar11 = (this->u).col.idx;
    piVar16 = (this->u).col.start;
  }
  else {
    pdVar2 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->u).row.idx;
    piVar7 = (this->temp).s_mark;
    pdVar8 = this->work;
    pPVar3 = (this->temp).pivot_col;
    piVar16 = (this->u).col.start;
    piVar13 = (this->u).col.len;
    piVar14 = (this->temp).s_cact;
    piVar11 = (this->u).col.idx;
    do {
      iVar19 = piVar6[lVar20];
      piVar7[iVar19] = 1;
      pdVar8[iVar19] = pdVar2[lVar20];
      pPVar4 = pPVar3[iVar19].next;
      pPVar5 = pPVar3[iVar19].prev;
      pPVar4->prev = pPVar5;
      pPVar5->next = pPVar4;
      iVar10 = (piVar13[iVar19] + piVar16[iVar19]) - piVar14[iVar19];
      piVar9 = piVar11 + iVar10;
      do {
        piVar17 = piVar9;
        piVar9 = piVar17 + 1;
      } while (*piVar17 != prow);
      *piVar17 = piVar11[iVar10];
      piVar11[iVar10] = prow;
      piVar14[iVar19] = piVar14[iVar19] + -1;
      lVar20 = lVar20 + 1;
    } while (lVar20 < lVar15);
  }
  iVar10 = piVar13[p_col];
  uVar21 = (long)iVar10 - (long)piVar14[p_col];
  iVar19 = piVar11[(long)piVar16[p_col] + uVar21];
  lv = iVar12;
  if (iVar19 != prow) {
    do {
      iVar12 = lv + 1;
      updateRow(this,iVar19,lv,prow,p_col,val,eps);
      uVar18 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar18;
      iVar19 = (this->u).col.idx[(int)((this->u).col.start[p_col] + uVar18)];
      lv = iVar12;
    } while (iVar19 != prow);
    piVar13 = (this->u).col.len;
    iVar10 = piVar13[p_col];
  }
  iVar19 = (int)uVar21 + 1;
  if (iVar19 < iVar10) {
    do {
      updateRow(this,(this->u).col.idx[(this->u).col.start[p_col] + iVar19],iVar12,prow,p_col,val,
                eps);
      iVar19 = iVar19 + 1;
      iVar12 = iVar12 + 1;
    } while (iVar10 != iVar19);
    piVar13 = (this->u).col.len;
    iVar10 = piVar13[p_col];
  }
  piVar14 = (this->temp).s_cact;
  piVar13[p_col] = iVar10 - piVar14[p_col];
  if (1 < iVar1) {
    piVar11 = (this->u).row.idx;
    lVar15 = (long)(this->u).row.start[prow];
    lVar20 = (long)iVar1 + -1 + lVar15;
    pdVar8 = this->work;
    piVar16 = (this->temp).s_mark;
    pPVar3 = (this->temp).pivot_colNZ;
    pPVar4 = (this->temp).pivot_col;
    do {
      iVar19 = piVar11[lVar15];
      pdVar8[iVar19] = 0.0;
      piVar16[iVar19] = 0;
      iVar1 = piVar14[iVar19];
      pPVar5 = pPVar3[iVar1].next;
      pPVar4[iVar19].next = pPVar5;
      pPVar5->prev = pPVar4 + iVar19;
      pPVar4[iVar19].prev = pPVar3 + iVar1;
      pPVar3[iVar1].next = pPVar4 + iVar19;
      lVar15 = lVar15 + 1;
    } while (lVar15 < lVar20);
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminatePivot(int prow, int pos, R eps)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   R pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L VectorBase<R> */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working VectorBase<R>,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval, eps);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval, eps);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working VectorBase<R> and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}